

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter_state.cpp
# Opt level: O3

unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true> __thiscall
duckdb::TableFilterState::Initialize
          (TableFilterState *this,ClientContext *context,TableFilter *filter)

{
  pointer puVar1;
  StructFilter *pSVar2;
  ExpressionFilter *pEVar3;
  type expression;
  ExpressionFilterState *this_00;
  ConjunctionAndFilter *pCVar4;
  pointer pCVar5;
  type pTVar6;
  ConjunctionOrFilter *pCVar7;
  pointer pCVar8;
  InternalException *this_01;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  pointer puVar9;
  TableFilterState local_58;
  string local_50;
  
  while (filter->filter_type == STRUCT_EXTRACT) {
    pSVar2 = TableFilter::Cast<duckdb::StructFilter>(filter);
    filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator*(&pSVar2->child_filter);
  }
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
  case IS_NULL:
  case IS_NOT_NULL:
  case OPTIONAL_FILTER:
    local_50._M_dataplus._M_p = (pointer)operator_new(8);
    *(undefined ***)local_50._M_dataplus._M_p = &PTR__TableFilterState_0244f010;
    break;
  case CONJUNCTION_OR:
    pCVar7 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    local_50._M_dataplus._M_p = (pointer)operator_new(0x20);
    *(undefined ***)local_50._M_dataplus._M_p = &PTR__ConjunctionOrFilterState_0244f170;
    *(_func_int **)((long)local_50._M_dataplus._M_p + 8) = (_func_int *)0x0;
    *(_func_int **)((long)local_50._M_dataplus._M_p + 0x10) = (_func_int *)0x0;
    *(_func_int **)((long)local_50._M_dataplus._M_p + 0x18) = (_func_int *)0x0;
    puVar9 = (pCVar7->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pCVar7->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar9 != puVar1) {
      do {
        pCVar8 = unique_ptr<duckdb::ConjunctionOrFilterState,_std::default_delete<duckdb::ConjunctionOrFilterState>,_true>
                 ::operator->((unique_ptr<duckdb::ConjunctionOrFilterState,_std::default_delete<duckdb::ConjunctionOrFilterState>,_true>
                               *)&local_50);
        pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(puVar9);
        Initialize(&local_58,context,pTVar6);
        ::std::
        vector<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>>
                    *)&pCVar8->child_states,
                   (unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                    *)&local_58);
        if (local_58._vptr_TableFilterState != (_func_int **)0x0) {
          (**(code **)(*local_58._vptr_TableFilterState + 8))();
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar1);
    }
    break;
  case CONJUNCTION_AND:
    pCVar4 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    local_50._M_dataplus._M_p = (pointer)operator_new(0x20);
    *(undefined ***)local_50._M_dataplus._M_p = &PTR__ConjunctionAndFilterState_0244f1a8;
    *(_func_int **)((long)local_50._M_dataplus._M_p + 8) = (_func_int *)0x0;
    *(_func_int **)((long)local_50._M_dataplus._M_p + 0x10) = (_func_int *)0x0;
    *(_func_int **)((long)local_50._M_dataplus._M_p + 0x18) = (_func_int *)0x0;
    puVar9 = (pCVar4->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pCVar4->super_ConjunctionFilter).child_filters.
             super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar9 != puVar1) {
      do {
        pCVar5 = unique_ptr<duckdb::ConjunctionAndFilterState,_std::default_delete<duckdb::ConjunctionAndFilterState>,_true>
                 ::operator->((unique_ptr<duckdb::ConjunctionAndFilterState,_std::default_delete<duckdb::ConjunctionAndFilterState>,_true>
                               *)&local_50);
        pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(puVar9);
        Initialize(&local_58,context,pTVar6);
        ::std::
        vector<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::TableFilterState,std::default_delete<duckdb::TableFilterState>,true>>>
                    *)&pCVar5->child_states,
                   (unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                    *)&local_58);
        if (local_58._vptr_TableFilterState != (_func_int **)0x0) {
          (**(code **)(*local_58._vptr_TableFilterState + 8))();
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar1);
    }
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unsupported filter type for TableFilterState::Initialize","");
    InternalException::InternalException(this_01,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case EXPRESSION_FILTER:
    pEVar3 = TableFilter::Cast<duckdb::ExpressionFilter>(filter);
    expression = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&pEVar3->expr);
    this_00 = (ExpressionFilterState *)operator_new(0x50);
    ExpressionFilterState::ExpressionFilterState(this_00,context,expression);
    this->_vptr_TableFilterState = (_func_int **)this_00;
    return (unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
            )this;
  }
  this->_vptr_TableFilterState = (_func_int **)local_50._M_dataplus._M_p;
  return (unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>)
         (unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>_>)this;
}

Assistant:

unique_ptr<TableFilterState> TableFilterState::Initialize(ClientContext &context, const TableFilter &filter) {
	switch (filter.filter_type) {
	case TableFilterType::OPTIONAL_FILTER:
		// optional filter is not executed - create an empty filter state
		return make_uniq<TableFilterState>();
	case TableFilterType::STRUCT_EXTRACT: {
		auto &struct_filter = filter.Cast<StructFilter>();
		return Initialize(context, *struct_filter.child_filter);
	}
	case TableFilterType::CONJUNCTION_OR: {
		auto &conj_filter = filter.Cast<ConjunctionOrFilter>();
		auto result = make_uniq<ConjunctionOrFilterState>();
		for (auto &child_filter : conj_filter.child_filters) {
			result->child_states.push_back(Initialize(context, *child_filter));
		}
		return std::move(result);
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conj_filter = filter.Cast<ConjunctionAndFilter>();
		auto result = make_uniq<ConjunctionAndFilterState>();
		for (auto &child_filter : conj_filter.child_filters) {
			result->child_states.push_back(Initialize(context, *child_filter));
		}
		return std::move(result);
	}
	case TableFilterType::EXPRESSION_FILTER: {
		auto &expr_filter = filter.Cast<ExpressionFilter>();
		return make_uniq<ExpressionFilterState>(context, *expr_filter.expr);
	}
	case TableFilterType::CONSTANT_COMPARISON:
	case TableFilterType::IS_NULL:
	case TableFilterType::IS_NOT_NULL:
		// root nodes - create an empty filter state
		return make_uniq<TableFilterState>();
	default:
		throw InternalException("Unsupported filter type for TableFilterState::Initialize");
	}
}